

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_distributions.cc
# Opt level: O2

void continuous_dist_test_streamable<trng::gamma_dist<long_double>>(gamma_dist<long_double> *d)

{
  longdouble lVar1;
  longdouble lVar2;
  param_type p_new;
  StringRef local_220;
  AssertionHandler catchAssertionHandler;
  StringRef local_1c8;
  SourceLineInfo local_1b8;
  stringstream str;
  basic_ostream<char,_std::char_traits<char>_> local_198 [376];
  
  p_new.kappa_._0_10_ = (longdouble)1;
  p_new.theta_._0_10_ = p_new.kappa_._0_10_;
  std::__cxx11::stringstream::stringstream((stringstream *)&str);
  trng::operator<<(local_198,&d->P);
  trng::operator>>((basic_istream<char,_std::char_traits<char>_> *)&str,&p_new);
  lVar2 = p_new.theta_._0_10_;
  lVar1 = p_new.kappa_._0_10_;
  local_220.m_start = "REQUIRE";
  local_220.m_size = 7;
  local_1b8.file =
       "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_distributions.cc"
  ;
  local_1b8.line = 0xcd;
  Catch::StringRef::StringRef(&local_1c8,"(d == d_new)");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,&local_220,&local_1b8,local_1c8,Normal);
  local_220.m_start =
       (char *)CONCAT71(local_220.m_start._1_7_,
                        *(longdouble *)&(d->P).theta_ == lVar2 &&
                        lVar1 == *(longdouble *)&(d->P).kappa_);
  Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_220);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  std::__cxx11::stringstream::~stringstream((stringstream *)&str);
  return;
}

Assistant:

void continuous_dist_test_streamable(dist &d) {
  typename dist::param_type p_new;
  std::stringstream str;
  str << d.param();
  str >> p_new;
  dist d_new{p_new};
  REQUIRE((d == d_new));
}